

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmHexFileConverter.cxx
# Opt level: O0

bool ConvertMotorolaSrecLine(char *buf,FILE *outFile)

{
  uint uVar1;
  uint local_28;
  uint dataStart;
  uint slen;
  FILE *outFile_local;
  char *buf_local;
  
  uVar1 = ChompStrlen(buf);
  if ((uVar1 < 10) || (0x20e < uVar1)) {
    buf_local._7_1_ = false;
  }
  else if ((uVar1 & 1) == 1) {
    buf_local._7_1_ = false;
  }
  else if (*buf == 'S') {
    if ((((buf[1] == '5') || (buf[1] == '7')) || (buf[1] == '8')) || (buf[1] == '9')) {
      buf_local._7_1_ = true;
    }
    else {
      if (buf[1] == '1') {
        local_28 = 8;
      }
      else if (buf[1] == '2') {
        local_28 = 10;
      }
      else {
        if (buf[1] != '3') {
          return false;
        }
        local_28 = 0xc;
      }
      buf_local._7_1_ = OutputBin(outFile,buf,local_28,uVar1 - 2);
    }
  }
  else {
    buf_local._7_1_ = false;
  }
  return buf_local._7_1_;
}

Assistant:

static bool ConvertMotorolaSrecLine(const char* buf, FILE* outFile)
{
  unsigned int slen = ChompStrlen(buf);
  if ((slen < MOTOROLA_SREC_MIN_LINE_LENGTH) ||
      (slen > MOTOROLA_SREC_MAX_LINE_LENGTH)) {
    return false;
  }

  // line length must be even
  if (slen % 2 == 1) {
    return false;
  }

  if (buf[0] != 'S') {
    return false;
  }

  unsigned int dataStart = 0;
  // ignore extra address records
  if ((buf[1] == '5') || (buf[1] == '7') || (buf[1] == '8') ||
      (buf[1] == '9')) {
    return true;
  }
  if (buf[1] == '1') {
    dataStart = 8;
  } else if (buf[1] == '2') {
    dataStart = 10;
  } else if (buf[1] == '3') {
    dataStart = 12;
  } else // unknown record type
  {
    return false;
  }

  // ignore the last two bytes  (checksum)
  return OutputBin(outFile, buf, dataStart, slen - 2);
}